

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::TestCaseFilter::isMatch(TestCaseFilter *this,TestCaseInfo *testCase)

{
  string *psVar1;
  size_t __n;
  int iVar2;
  long lVar3;
  logic_error *this_00;
  bool bVar4;
  long *local_30;
  size_t local_28;
  long local_20 [2];
  
  if (WildcardAtBothEnds < this->m_wildcardPosition) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unhandled wildcard type");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  psVar1 = &testCase->m_name;
  switch(this->m_wildcardPosition) {
  case NoWildcard:
    __n = (this->m_stringToMatch)._M_string_length;
    if (__n == (testCase->m_name)._M_string_length) {
      if (__n != 0) {
        iVar2 = bcmp((this->m_stringToMatch)._M_dataplus._M_p,(psVar1->_M_dataplus)._M_p,__n);
        return iVar2 == 0;
      }
      return true;
    }
    break;
  case WildcardAtStart:
    if ((this->m_stringToMatch)._M_string_length <= (testCase->m_name)._M_string_length) {
LAB_001365c2:
      std::__cxx11::string::substr((ulong)&local_30,(ulong)psVar1);
      if (local_28 == (this->m_stringToMatch)._M_string_length) {
        if (local_28 == 0) {
          bVar4 = true;
        }
        else {
          iVar2 = bcmp(local_30,(this->m_stringToMatch)._M_dataplus._M_p,local_28);
          bVar4 = iVar2 == 0;
        }
      }
      else {
        bVar4 = false;
      }
      if (local_30 == local_20) {
        return bVar4;
      }
      operator_delete(local_30,local_20[0] + 1);
      return bVar4;
    }
    break;
  case WildcardAtEnd:
    if ((this->m_stringToMatch)._M_string_length <= (testCase->m_name)._M_string_length)
    goto LAB_001365c2;
    break;
  case WildcardAtBothEnds:
    lVar3 = std::__cxx11::string::find
                      ((char *)psVar1,(ulong)(this->m_stringToMatch)._M_dataplus._M_p,0);
    return lVar3 != -1;
  }
  return false;
}

Assistant:

bool isMatch( const TestCaseInfo& testCase ) const {
            const std::string& name = testCase.getName();

            switch( m_wildcardPosition ) {
                case NoWildcard:
                    return m_stringToMatch == name;
                case WildcardAtStart:
                    return endsWith( name, m_stringToMatch );
                case WildcardAtEnd:
                    return startsWith( name, m_stringToMatch );
                case WildcardAtBothEnds:
                    return contains( name, m_stringToMatch );
            }
            throw std::logic_error( "Unhandled wildcard type" );
        }